

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parser.cpp
# Opt level: O1

MPP_RET mpp_parser_control(Parser prs,MpiCmd cmd,void *para)

{
  MPP_RET MVar1;
  undefined4 in_register_00000034;
  
  if (prs == (Parser)0x0) {
    _mpp_log_l(2,"mpp_dec","found NULL input\n","mpp_parser_control");
    return MPP_ERR_NULL_PTR;
  }
  if (*(code **)(*prs + 0x48) != (code *)0x0) {
    MVar1 = (**(code **)(*prs + 0x48))
                      (*(undefined8 *)((long)prs + 8),CONCAT44(in_register_00000034,cmd));
    return MVar1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_parser_control(Parser prs, MpiCmd cmd, void *para)
{
    if (NULL == prs) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    ParserImpl *p = (ParserImpl *)prs;
    if (!p->api->control)
        return MPP_OK;

    return p->api->control(p->ctx, cmd, para);
}